

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall BenevolentBotStrategy::defendNumDice(BenevolentBotStrategy *this)

{
  return (1 < *((this->super_PlayerStrategy).to)->pNumberOfTroops) + 1;
}

Assistant:

int BenevolentBotStrategy::defendNumDice() {
    int numDice = 0;
    if (to->getNumberOfTroops() >= 2) {
        numDice = 2;
    }
    else {
        numDice = 1;
    }
    return numDice;
}